

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ReportLastSystemError(char *msg)

{
  string m;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  local_48.View_._M_len = strlen(msg);
  local_78.View_._M_len = 0x10;
  local_78.View_._M_str = ": System Error: ";
  local_48.View_._M_str = msg;
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  cmStrCat<std::__cxx11::string>(&sStack_b8,&local_48,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  Error(&sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m =
    cmStrCat(msg, ": System Error: ", Superclass::GetLastSystemError());
  cmSystemTools::Error(m);
}